

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::GetSCCAnalysis(SCCAnalyzer *this,SCC *scc)

{
  map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *this_00;
  pointer ppDVar1;
  Descriptor *pDVar2;
  long lVar3;
  SCCAnalyzer *this_01;
  Type TVar4;
  MessageAnalysis MVar5;
  size_type sVar6;
  MessageAnalysis *pMVar7;
  Descriptor *descriptor;
  SCC *scc_00;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  int i;
  long lVar12;
  long lVar13;
  SCC *scc_local;
  undefined8 local_50;
  map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *local_48;
  ulong local_40;
  SCCAnalyzer *local_38;
  
  this_00 = &this->analysis_cache_;
  scc_local = scc;
  sVar6 = std::
          map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
          ::count(this_00,&scc_local);
  if (sVar6 == 0) {
    bVar11 = false;
    bVar10 = false;
    bVar8 = false;
    local_50 = 0;
    uVar9 = 0;
    local_48 = this_00;
    local_38 = this;
    while (ppDVar1 = (scc_local->descriptors).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(scc_local->descriptors).
                                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3)) {
      pDVar2 = ppDVar1[uVar9];
      if (0 < *(int *)(pDVar2 + 0x68)) {
        bVar10 = true;
      }
      lVar13 = 0;
      local_40 = uVar9;
      for (lVar12 = 0; lVar12 < *(int *)(pDVar2 + 0x2c); lVar12 = lVar12 + 1) {
        lVar3 = *(long *)(pDVar2 + 0x30);
        if (*(int *)(lVar3 + 0x4c + lVar13) == 2) {
          bVar11 = true;
        }
        TVar4 = FieldDescriptor::type((FieldDescriptor *)(lVar3 + lVar13));
        if (TVar4 - TYPE_GROUP < 2) {
          descriptor = FieldDescriptor::message_type((FieldDescriptor *)(lVar3 + lVar13));
          this_01 = local_38;
          scc_00 = GetSCC(local_38,descriptor);
          if (scc_00 == scc_local) {
            local_50 = CONCAT71((int7)((ulong)scc_00 >> 8),1);
          }
          else {
            MVar5 = GetSCCAnalysis(this_01,scc_00);
            bVar8 = (bool)(bVar8 | MVar5.contains_cord & 1U);
            bVar10 = (bool)(bVar10 | MVar5.contains_extension & 1U);
            bVar11 = (bool)(bVar11 | MVar5.contains_required & 1U);
          }
        }
        else if (((TVar4 == TYPE_BYTES) || (TVar4 == TYPE_STRING)) &&
                (*(int *)(*(long *)(lVar3 + 0x80 + lVar13) + 0x68) == 1)) {
          bVar8 = true;
        }
        lVar13 = lVar13 + 0xa8;
      }
      uVar9 = local_40 + 1;
    }
    pMVar7 = std::
             map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](local_48,&scc_local);
    pMVar7->is_recursive = SUB81(local_50,0);
    pMVar7->contains_cord = bVar8;
    pMVar7->contains_extension = bVar10;
    pMVar7->contains_required = bVar11;
  }
  else {
    pMVar7 = std::
             map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](this_00,&scc_local);
  }
  return *pMVar7;
}

Assistant:

MessageAnalysis SCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  if (analysis_cache_.count(scc)) return analysis_cache_[scc];
  MessageAnalysis result = MessageAnalysis();
  for (int i = 0; i < scc->descriptors.size(); i++) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int i = 0; i < descriptor->field_count(); i++) {
      const FieldDescriptor* field = descriptor->field(i);
      if (field->is_required()) {
        result.contains_required = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->options().ctype() == FieldOptions::CORD) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = result;
}